

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O0

_Bool mat4_decompose(mat4_t m,vec3_t *scale,quat_t *rot,vec3_t *trans)

{
  mat3_t m_00;
  mat4_t m_01;
  float x;
  float y;
  float z;
  vec3_t vVar1;
  vec3_t a;
  vec3_t vVar2;
  quat_t qVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 in_stack_fffffffffffffde8;
  mat3_t local_1cc;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined8 local_184;
  float local_17c;
  undefined8 local_178;
  float local_170;
  undefined8 local_168;
  float local_160;
  undefined8 local_154;
  float local_14c;
  undefined8 local_148;
  float local_140;
  undefined8 local_138;
  float local_130;
  undefined8 local_124;
  float local_11c;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f4;
  float local_ec;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d4;
  float local_cc;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  float local_ac;
  undefined8 uStack_a8;
  float det;
  float local_a0;
  undefined8 local_98;
  vec3_t col2;
  undefined8 local_78;
  vec3_t col1;
  undefined8 local_58;
  vec3_t col0;
  _Bool ret;
  mat3_t rot_matrix;
  vec3_t *trans_local;
  quat_t *rot_local;
  vec3_t *scale_local;
  
  col0.y._3_1_ = true;
  vVar1 = vec3(m.m[0][0],m.m[0][1],m.m[0][2]);
  col0.x = vVar1.z;
  local_58 = vVar1._0_8_;
  a = vec3(m.m[1][0],m.m[1][1],m.m[1][2]);
  col1.x = a.z;
  local_78 = a._0_8_;
  unique0x10000b22 = local_78;
  vVar2 = vec3(m.m[2][0],m.m[2][1],m.m[2][2]);
  local_a0 = vVar2.z;
  uStack_a8 = vVar2._0_8_;
  m_01._56_8_ = in_stack_fffffffffffffde8;
  m_01._0_56_ = m._8_56_;
  uVar4 = m.m[2][1];
  uVar5 = m.m[2][2];
  local_98 = uStack_a8;
  col2.x = local_a0;
  local_ac = mat4_determinant(m_01);
  x = vec4_length((vec4_t)m);
  y = vec4_length(m.col[1]);
  z = vec4_length(m.col[2]);
  vVar2 = vec3(x,y,z);
  local_c0 = vVar2.z;
  local_c8 = vVar2._0_8_;
  scale->z = local_c0;
  scale->x = (float)(int)local_c8;
  scale->y = (float)(int)((ulong)local_c8 >> 0x20);
  local_b8 = local_c8;
  local_b0 = local_c0;
  vVar2 = vec3(m.m[3][0],m.m[3][1],m.m[3][2]);
  local_e0 = vVar2.z;
  local_e8 = vVar2._0_8_;
  trans->x = (float)(int)local_e8;
  trans->y = (float)(int)((ulong)local_e8 >> 0x20);
  trans->z = local_e0;
  local_d4 = local_e8;
  local_cc = local_e0;
  if (local_ac < 0.0) {
    local_100 = scale->z;
    local_108._0_4_ = scale->x;
    local_108._4_4_ = scale->y;
    vVar2 = vec3_neg(*scale);
    local_110 = vVar2.z;
    local_118 = vVar2._0_8_;
    scale->x = (float)(int)local_118;
    scale->y = (float)(int)((ulong)local_118 >> 0x20);
    scale->z = local_110;
    local_f4 = local_118;
    local_ec = local_110;
  }
  if ((scale->x != 0.0) || (NAN(scale->x))) {
    local_138 = local_58;
    local_130 = col0.x;
    vVar1 = vec3_divf(vVar1,scale->x);
    local_140 = vVar1.z;
    local_148 = vVar1._0_8_;
    local_124 = local_148;
    local_11c = local_140;
    local_58 = local_148;
    col0.x = local_140;
  }
  else {
    col0.y._3_1_ = false;
  }
  if ((scale->y != 0.0) || (NAN(scale->y))) {
    local_168 = local_78;
    local_160 = col1.x;
    vVar1 = vec3_divf(a,scale->y);
    local_170 = vVar1.z;
    local_178 = vVar1._0_8_;
    local_154 = local_178;
    local_14c = local_170;
    local_78 = local_178;
    col1.x = local_170;
  }
  else {
    col0.y._3_1_ = false;
  }
  if ((scale->z != 0.0) || (NAN(scale->z))) {
    local_190 = col2.x;
    local_198 = local_98;
    vVar1.z = col2.x;
    vVar1.x = (float)local_98;
    vVar1.y = local_98._4_4_;
    vVar1 = vec3_divf(vVar1,scale->z);
    local_1a0 = vVar1.z;
    local_1a8 = vVar1._0_8_;
    local_184 = local_1a8;
    local_17c = local_1a0;
    local_98 = local_1a8;
    col2.x = local_1a0;
  }
  else {
    col0.y._3_1_ = false;
  }
  mat3(&local_1cc,(float)local_58,local_58._4_4_,col0.x,(float)local_78,local_78._4_4_,col1.x,
       (float)local_98,local_98._4_4_,col2.x);
  m_00._8_8_ = local_1cc._16_8_;
  m_00._0_8_ = local_1cc._8_8_;
  m_00._16_8_ = local_1cc._24_8_;
  m_00.m[2][0] = local_1cc.m[2][2];
  m_00.m[2][1] = (float)uVar4;
  m_00.m[2][2] = (float)uVar5;
  qVar3 = quat_from_mat3(m_00);
  rot->x = (float)(int)qVar3._0_8_;
  rot->y = (float)(int)((ulong)qVar3._0_8_ >> 0x20);
  rot->z = (float)(int)qVar3._8_8_;
  rot->w = (float)(int)((ulong)qVar3._8_8_ >> 0x20);
  return col0.y._3_1_;
}

Assistant:

bool
mat4_decompose(mat4_t m, vec3_t* scale, quat_t* rot, vec3_t* trans) {
    mat3_t	rot_matrix;
    bool	ret		= true;
    vec3_t	col0	= vec3(m.col[0].x, m.col[0].y, m.col[0].z);
    vec3_t	col1	= vec3(m.col[1].x, m.col[1].y, m.col[1].z);
    vec3_t	col2	= vec3(m.col[2].x, m.col[2].y, m.col[2].z);
    float	det	= mat4_determinant(m);

    *scale	= vec3(vec4_length(m.col[0]), vec4_length(m.col[1]), vec4_length(m.col[2]));
    *trans	= vec3(m.col[3].x, m.col[3].y, m.col[3].z);

    if( det < 0 )
        *scale	= vec3_neg(*scale);

    if( scale->x != 0.0f ) {
        col0	= vec3_divf(col0, scale->x);
    } else {
        ret		= false;
    }

    if( scale->y != 0.0f ) {
        col1	= vec3_divf(col1, scale->y);
    } else {
        ret		= false;
    }

    if( scale->z != 0.0f ) {
        col2	= vec3_divf(col2, scale->z);
    } else {
        ret		= false;
    }

    rot_matrix	= mat3(col0.x, col0.y, col0.z,
                   col1.x, col1.y, col1.z,
                   col2.x, col2.y, col2.z);

    *rot	= quat_from_mat3(rot_matrix);

    return ret;
}